

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

void save_components_to_files
               (TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int format,
               char *filepath1,char *filepath2,char *filepath3)

{
  uchar uVar1;
  TRIPLERGB *pTVar2;
  undefined1 auVar3 [16];
  TRIPLERGB **matrix;
  TRIPLERGB **matrix_00;
  TRIPLERGB **matrix_01;
  TRIPLERGB *pTVar4;
  TRIPLERGB *pTVar5;
  TRIPLERGB *pTVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  lVar11 = (long)(int)bmInfo.biHeight;
  uVar9 = lVar11 * 8;
  if (lVar11 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar9);
  matrix_00 = (TRIPLERGB **)operator_new__(uVar9);
  matrix_01 = (TRIPLERGB **)operator_new__(uVar9);
  if (lVar11 != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)bmInfo.biWidth;
    uVar9 = SUB168(auVar3 * ZEXT816(3),0);
    if (SUB168(auVar3 * ZEXT816(3),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    lVar10 = 0;
    do {
      pTVar4 = (TRIPLERGB *)operator_new__(uVar9);
      matrix[lVar10] = pTVar4;
      pTVar5 = (TRIPLERGB *)operator_new__(uVar9);
      matrix_00[lVar10] = pTVar5;
      pTVar6 = (TRIPLERGB *)operator_new__(uVar9);
      matrix_01[lVar10] = pTVar6;
      if (bmInfo.biWidth != 0) {
        lVar7 = 2;
        uVar8 = (long)(int)bmInfo.biWidth;
        do {
          if (format == 1) {
            pTVar2 = mrx[lVar10];
            uVar1 = (&pTVar2->blue)[lVar7];
            *(uchar *)((long)pTVar4 + lVar7 + -2) = uVar1;
            *(uchar *)((long)pTVar4 + lVar7 + -1) = uVar1;
            (&pTVar4->blue)[lVar7] = uVar1;
            uVar1 = *(uchar *)((long)pTVar2 + lVar7 + -1);
            *(uchar *)((long)pTVar5 + lVar7 + -2) = uVar1;
            *(uchar *)((long)pTVar5 + lVar7 + -1) = uVar1;
            (&pTVar5->blue)[lVar7] = uVar1;
            uVar1 = *(uchar *)((long)pTVar2 + lVar7 + -2);
            *(uchar *)((long)pTVar6 + lVar7 + -2) = uVar1;
            *(uchar *)((long)pTVar6 + lVar7 + -1) = uVar1;
            (&pTVar6->blue)[lVar7] = uVar1;
          }
          else if (format == 0) {
            pTVar2 = mrx[lVar10];
            (&pTVar4->blue)[lVar7] = (&pTVar2->blue)[lVar7];
            *(undefined1 *)((long)pTVar5 + lVar7 + -1) = *(undefined1 *)((long)pTVar2 + lVar7 + -1);
            *(undefined1 *)((long)pTVar6 + lVar7 + -2) = *(undefined1 *)((long)pTVar2 + lVar7 + -2);
          }
          lVar7 = lVar7 + 3;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar11);
  }
  if ((uint)format < 2) {
    saveBMPFile(bmFile,bmInfo,matrix,filepath1);
    saveBMPFile(bmFile,bmInfo,matrix_00,filepath2);
    saveBMPFile(bmFile,bmInfo,matrix_01,filepath3);
  }
  if (0 < (int)bmInfo.biHeight) {
    lVar10 = 0;
    do {
      if (matrix[lVar10] != (TRIPLERGB *)0x0) {
        operator_delete__(matrix[lVar10]);
      }
      if (matrix_00[lVar10] != (TRIPLERGB *)0x0) {
        operator_delete__(matrix_00[lVar10]);
      }
      if (matrix_01[lVar10] != (TRIPLERGB *)0x0) {
        operator_delete__(matrix_01[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar11 != lVar10);
  }
  operator_delete__(matrix);
  operator_delete__(matrix_00);
  operator_delete__(matrix_01);
  return;
}

Assistant:

void save_components_to_files(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int format,
                              const char *filepath1, const char *filepath2, const char *filepath3) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxA = new TRIPLERGB *[height];
    TRIPLERGB **mrxB = new TRIPLERGB *[height];
    TRIPLERGB **mrxC = new TRIPLERGB *[height];
    for (size_t i = 0; i < height; i++) {
        mrxA[i] = new TRIPLERGB[width];
        mrxB[i] = new TRIPLERGB[width];
        mrxC[i] = new TRIPLERGB[width];
        for (size_t j = 0; j < width; j++) {
            switch (format) {
                case FORMAT_RGB:
                    mrxA[i][j].red = mrx[i][j].red;
                    mrxB[i][j].green = mrx[i][j].green;
                    mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                case FORMAT_YCBCR:
                    mrxA[i][j].red = mrxA[i][j].green = mrxA[i][j].blue = mrx[i][j].red;
                    mrxB[i][j].red = mrxB[i][j].green = mrxB[i][j].blue = mrx[i][j].green;
                    mrxC[i][j].red = mrxC[i][j].green = mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                default:
                    break;
            }
        }
    }
    switch (format) {
        case FORMAT_RGB:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        case FORMAT_YCBCR:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        default:
            break;
    }
    for (int i = 0; i < height; i++) {
        delete[] mrxA[i];
        delete[] mrxB[i];
        delete[] mrxC[i];
    }
    delete[] mrxA;
    delete[] mrxB;
    delete[] mrxC;
}